

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O2

long __thiscall o3dgc::AdjacencyInfo::Begin(AdjacencyInfo *this,long element)

{
  uint __line;
  long lVar1;
  char *__assertion;
  
  if (element < this->m_numElements) {
    if (-1 < element) {
      if (element == 0) {
        lVar1 = 0;
      }
      else {
        lVar1 = this->m_numNeighbors[element + -1];
      }
      return lVar1;
    }
    __assertion = "element >= 0";
    __line = 0x7c;
  }
  else {
    __assertion = "element < m_numElements";
    __line = 0x7b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcAdjacencyInfo.h"
                ,__line,"long o3dgc::AdjacencyInfo::Begin(long) const");
}

Assistant:

long                    Begin(long element) const 
                                {
                                    assert(element < m_numElements);
                                    assert(element >= 0);
                                    return (element>0)?m_numNeighbors[element-1]:0;
                                }